

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::url_seed_alert::message_abi_cxx11_(string *__return_storage_ptr__,url_seed_alert *this)

{
  error_category *peVar1;
  char *__rhs;
  string sStack_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  torrent_alert::message_abi_cxx11_(&local_38,&this->super_torrent_alert);
  std::operator+(&local_98,&local_38," url seed (");
  __rhs = server_url(this);
  std::operator+(&local_78,&local_98,__rhs);
  std::operator+(&local_58,&local_78,") failed: ");
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&sStack_d8,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&local_b8,&sStack_d8);
  std::operator+(__return_storage_ptr__,&local_58,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&sStack_d8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string url_seed_alert::message() const
	{
		return torrent_alert::message() + " url seed ("
			+ server_url() + ") failed: " + convert_from_native(error.message());
	}